

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

void __thiscall mocker::ir::FunctionModule::sortBasicBlocks(FunctionModule *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  _List_node_base **pp_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  long lVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *plVar10;
  bool bVar11;
  list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> __carry;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> local_658;
  _List_node_base *local_640;
  undefined1 local_638 [16];
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> local_628 [8];
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> local_620 [1520];
  
  local_640 = (_List_node_base *)&this->bbs;
  p_Var9 = (this->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if ((p_Var9 != local_640) && (p_Var9->_M_next != local_640)) {
    local_658._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_658;
    local_658._M_impl._M_node._M_size = 0;
    lVar5 = 0;
    do {
      plVar10 = local_620 + lVar5 + -0x18;
      *(list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> **)
       (local_620 + lVar5 + -0x10) = plVar10;
      *(list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> **)plVar10 = plVar10;
      *(undefined8 *)(local_620 + lVar5 + -8) = 0;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x600);
    lVar5 = 0;
    local_658._M_impl._M_node.super__List_node_base._M_prev =
         local_658._M_impl._M_node.super__List_node_base._M_next;
    do {
      lVar7 = lVar5;
      p_Var9 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                &local_640->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var9->_M_next != local_658._M_impl._M_node.super__List_node_base._M_next &&
          local_658._M_impl._M_node.super__List_node_base._M_next != p_Var9) {
        std::__detail::_List_node_base::_M_transfer
                  (local_658._M_impl._M_node.super__List_node_base._M_next,p_Var9);
        local_658._M_impl._M_node._M_size =
             (long)(_List_node_base **)local_658._M_impl._M_node._M_size + 1;
        psVar1 = &(this->bbs).
                  super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
      }
      p_Var9 = (_List_node_base *)(local_620 + lVar7 + -0x18);
      bVar11 = lVar7 == 0;
      if (bVar11) {
        lVar5 = 0x18;
        p_Var8 = (_List_node_base *)local_638;
      }
      else {
        p_Var8 = (_List_node_base *)local_638;
        if ((_List_node_base *)local_638._0_8_ == p_Var8) {
          lVar5 = 0;
        }
        else {
          do {
            p_Var6 = p_Var8;
            std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
            merge<mocker::ir::FunctionModule::sortBasicBlocks()::__0>
                      ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)p_Var6
                       ,(_List_node_base *)&local_658);
            std::__detail::_List_node_base::swap((_List_node_base *)&local_658,p_Var6);
            p_Var2 = p_Var6[1]._M_next;
            p_Var6[1]._M_next = (_List_node_base *)local_658._M_impl._M_node._M_size;
            p_Var8 = (_List_node_base *)&p_Var6[1]._M_prev;
            bVar11 = p_Var8 == p_Var9;
            if (bVar11) {
              lVar5 = 0x18;
              goto LAB_0011717c;
            }
            local_658._M_impl._M_node._M_size = (size_t)p_Var2;
          } while (*(_List_node_base **)p_Var8 != p_Var8);
          lVar5 = 0;
LAB_0011717c:
          p_Var8 = (_List_node_base *)&p_Var6[1]._M_prev;
          local_658._M_impl._M_node._M_size = (size_t)p_Var2;
        }
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&local_658,p_Var8);
      p_Var6 = local_640;
      p_Var2 = p_Var8[1]._M_next;
      p_Var8[1]._M_next = (_List_node_base *)local_658._M_impl._M_node._M_size;
      lVar5 = lVar5 + lVar7;
      local_658._M_impl._M_node._M_size = (size_t)p_Var2;
    } while (local_640->_M_next != local_640);
    if (lVar5 != 0x18) {
      plVar10 = local_620;
      do {
        std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
        merge<mocker::ir::FunctionModule::sortBasicBlocks()::__0>(plVar10,plVar10 + -0x18);
        plVar10 = plVar10 + 0x18;
      } while (plVar10 != local_620 + lVar5 + -0x18);
    }
    pp_Var4 = (_List_node_base **)(local_638 + 0x10);
    if (!bVar11) {
      pp_Var4 = &local_640;
      p_Var9 = (_List_node_base *)
               ((long)&local_658._M_impl._M_node.super__List_node_base._M_prev + lVar7);
    }
    std::__detail::_List_node_base::swap(p_Var6,p_Var9);
    sVar3 = *(size_t *)((long)pp_Var4 + lVar7);
    *(size_t *)((long)pp_Var4 + lVar7) =
         (this->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node._M_size;
    (this->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
    _M_impl._M_node._M_size = sVar3;
    lVar5 = 0x5e8;
    do {
      std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
      _M_clear((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
               (local_620 + lVar5 + -0x18));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
    _M_clear(&local_658);
  }
  return;
}

Assistant:

void FunctionModule::sortBasicBlocks() {
  bbs.sort([](const BasicBlock &lhs, const BasicBlock &rhs) {
    return lhs.getLabelID() < rhs.getLabelID();
  });
}